

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operators.cpp
# Opt level: O3

bool duckdb::Equals::Operation<double>(double *left,double *right)

{
  double input;
  double input_00;
  bool bVar1;
  
  input = *left;
  input_00 = *right;
  bVar1 = Value::IsNan<double>(input);
  if ((bVar1) && (bVar1 = Value::IsNan<double>(input_00), bVar1)) {
    return true;
  }
  return (bool)(-(input == input_00) & 1);
}

Assistant:

bool Equals::Operation(const double &left, const double &right) {
	return EqualsFloat<double>(left, right);
}